

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void testing::internal::MatcherBase<std::pair<int,phmap::priv::NonStandardLayout>const&>::
     ValuePolicy<testing::internal::EqMatcher<std::pair<int,phmap::priv::NonStandardLayout>>,false>
     ::Init<testing::internal::EqMatcher<std::pair<int,phmap::priv::NonStandardLayout>>>
               (MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> *m,
               EqMatcher<std::pair<int,_phmap::priv::NonStandardLayout>_> *arg)

{
  SharedPayload<testing::internal::EqMatcher<std::pair<int,_phmap::priv::NonStandardLayout>_>_>
  *this;
  EqMatcher<std::pair<int,_phmap::priv::NonStandardLayout>_> *arg_local;
  MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> *m_local;
  
  this = (SharedPayload<testing::internal::EqMatcher<std::pair<int,_phmap::priv::NonStandardLayout>_>_>
          *)operator_new(0x38);
  SharedPayload<testing::internal::EqMatcher<std::pair<int,_phmap::priv::NonStandardLayout>_>_>::
  SharedPayload(this,arg);
  (m->buffer_).shared = (SharedPayloadBase *)this;
  return;
}

Assistant:

static void Init(MatcherBase& m, Arg&& arg) {
      m.buffer_.shared = new Shared(std::forward<Arg>(arg));
    }